

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_EstimateTxInVsize_Test::TestBody(ConfidentialTxIn_EstimateTxInVsize_Test *this)

{
  AddressType addr_type;
  uint32_t pegin_btc_tx_size;
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  long lVar4;
  char *message;
  Script *scriptsig_template;
  string *hex;
  initializer_list<TestEstimateConfidentialTxInSizeVector> __l;
  uint32_t vsize;
  allocator_type local_ac6;
  allocator local_ac5;
  allocator local_ac4;
  allocator local_ac3;
  allocator local_ac2;
  allocator local_ac1;
  allocator local_ac0;
  allocator local_abf;
  allocator local_abe;
  allocator local_abd;
  allocator local_abc;
  allocator local_abb;
  allocator local_aba;
  allocator local_ab9;
  pointer local_ab8;
  AssertHelper local_ab0;
  AssertionResult gtest_ar;
  string local_a88;
  ulong local_a68;
  Script local_a60;
  Script script_template;
  Script local_9d8;
  undefined2 local_9a0;
  bool local_99e;
  string local_998 [32];
  undefined8 local_978;
  uint32_t local_970;
  undefined8 local_968;
  undefined4 local_960;
  Script local_958;
  undefined4 local_920;
  Script local_918;
  undefined2 local_8e0;
  undefined1 local_8de;
  string local_8d8 [32];
  undefined8 local_8b8;
  undefined4 local_8b0;
  undefined8 local_8a8;
  undefined4 local_8a0;
  Script local_898;
  undefined4 local_860;
  Script local_858;
  undefined2 local_820;
  undefined1 local_81e;
  string local_818 [32];
  undefined8 local_7f8;
  undefined4 local_7f0;
  undefined8 local_7e8;
  undefined4 local_7e0;
  Script local_7d8;
  undefined4 local_7a0;
  Script local_798;
  undefined2 local_760;
  undefined1 local_75e;
  string local_758 [32];
  undefined8 local_738;
  undefined4 local_730;
  undefined8 local_728;
  undefined4 local_720;
  Script local_718;
  undefined4 local_6e0;
  Script local_6d8;
  undefined2 local_6a0;
  undefined1 local_69e;
  string local_698 [32];
  undefined8 local_678;
  undefined4 local_670;
  undefined8 local_668;
  undefined4 local_660;
  Script local_658;
  undefined4 local_620;
  Script local_618;
  undefined2 local_5e0;
  undefined1 local_5de;
  string local_5d8 [32];
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined8 local_5a8;
  undefined4 local_5a0;
  Script local_598;
  undefined4 local_560;
  Script local_558;
  undefined2 local_520;
  undefined1 local_51e;
  string local_518 [32];
  undefined8 local_4f8;
  undefined4 local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  Script local_4d8;
  undefined4 local_4a0;
  Script local_498;
  undefined2 local_460;
  undefined1 local_45e;
  string local_458 [32];
  undefined8 local_438;
  undefined4 local_430;
  undefined8 local_428;
  undefined4 local_420;
  Script local_418;
  undefined4 local_3e0;
  Script local_3d8;
  undefined2 local_3a0;
  undefined1 local_39e;
  string local_398 [32];
  undefined8 local_378;
  undefined4 local_370;
  undefined8 local_368;
  undefined4 local_360;
  Script local_358;
  undefined4 local_320;
  Script local_318;
  undefined2 local_2e0;
  undefined1 local_2de;
  string local_2d8 [32];
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  Script local_298;
  undefined4 local_260;
  Script local_258;
  undefined2 local_220;
  undefined1 local_21e;
  string local_218 [32];
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  Script local_1d8;
  undefined4 local_1a0;
  Script local_198;
  undefined2 local_160;
  undefined1 local_15e;
  string local_158 [32];
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  Script local_118;
  undefined4 local_e0;
  Script local_d8;
  undefined2 local_a0;
  undefined1 local_9e;
  string local_98 [32];
  undefined8 local_78;
  undefined4 local_70;
  Script local_68;
  
  if (TestBody()::multisig_script_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&TestBody()::multisig_script_abi_cxx11_,
                 "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
                 ,(allocator *)&script_template);
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
    }
  }
  if (TestBody()::test_vector == '\0') {
    iVar2 = __cxa_guard_acquire(&TestBody()::test_vector);
    if (iVar2 != 0) {
      script_template._vptr_Script = (_func_int **)0x9600000002;
      script_template.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      cfd::core::Script::Script
                ((Script *)
                 &script_template.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      cfd::core::Script::Script(&local_9d8);
      local_9a0._0_1_ = false;
      local_9a0._1_1_ = false;
      local_99e = false;
      std::__cxx11::string::string(local_998,"",(allocator *)&local_ab0);
      local_978._0_4_ = 0;
      local_978._4_4_ = 0;
      local_970 = 0;
      local_968 = 0xcd00000001;
      local_960 = 0;
      cfd::core::Script::Script(&local_958,&exp_script);
      local_920 = 0;
      cfd::core::Script::Script(&local_918);
      local_8e0 = 0;
      local_8de = 0;
      std::__cxx11::string::string(local_8d8,"",(allocator *)&vsize);
      local_8b8 = 0;
      local_8b0 = 0;
      local_8a8 = 0x5c00000006;
      local_8a0 = 0;
      cfd::core::Script::Script(&local_898);
      local_860 = 0;
      cfd::core::Script::Script(&local_858);
      local_820 = 0;
      local_81e = 0;
      std::__cxx11::string::string(local_818,"",&local_ab9);
      local_7f8 = 0;
      local_7f0 = 0;
      local_7e8 = 0x7100000005;
      local_7e0 = 0;
      std::__cxx11::string::string((string *)&gtest_ar,"51",&local_aba);
      cfd::core::Script::Script(&local_7d8,(string *)&gtest_ar);
      local_7a0 = 0;
      cfd::core::Script::Script(&local_798);
      local_760 = 0;
      local_75e = 0;
      std::__cxx11::string::string(local_758,"",&local_abb);
      local_738 = 0;
      local_730 = 0;
      local_728 = 0x4500000004;
      local_720 = 0;
      cfd::core::Script::Script(&local_718);
      local_6e0 = 0;
      cfd::core::Script::Script(&local_6d8);
      local_6a0 = 0;
      local_69e = 0;
      std::__cxx11::string::string(local_698,"",&local_abc);
      local_678 = 0;
      local_670 = 0;
      local_668 = 0x5300000003;
      local_660 = 0;
      cfd::core::Script::Script(&local_658,&exp_script);
      local_620 = 0;
      cfd::core::Script::Script(&local_618);
      local_5e0 = 0;
      local_5de = 0;
      std::__cxx11::string::string(local_5d8,"",&local_abd);
      local_5b8 = 0;
      local_5b0 = 0;
      local_5a8 = 0x6a00000003;
      local_5a0 = 0;
      cfd::core::Script::Script(&local_598,&TestBody()::multisig_script_abi_cxx11_);
      local_560 = 0;
      cfd::core::Script::Script(&local_558);
      local_520 = 0;
      local_51e = 0;
      std::__cxx11::string::string(local_518,"",&local_abe);
      local_4f8 = 0;
      local_4f0 = 0;
      local_4e8 = 0xfc00000004;
      local_4e0 = 0;
      cfd::core::Script::Script(&local_4d8);
      local_4a0 = 0xe2;
      std::__cxx11::string::string
                ((string *)&local_a88,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a",&local_abf);
      cfd::core::Script::Script(&local_498,&local_a88);
      local_460 = 0;
      local_45e = 0;
      std::__cxx11::string::string(local_458,"",&local_ac0);
      local_438 = 0;
      local_430 = 400;
      local_428 = 0x9700000004;
      local_420 = 0;
      cfd::core::Script::Script(&local_418);
      local_3e0 = 0;
      cfd::core::Script::Script(&local_3d8);
      local_3a0 = 1;
      local_39e = 0;
      std::__cxx11::string::string(local_398,"",&local_ac1);
      local_378 = 0;
      local_370 = 0;
      local_368 = 0x8cd00000004;
      local_360 = 0;
      cfd::core::Script::Script(&local_358);
      local_320 = 0;
      cfd::core::Script::Script(&local_318);
      local_2e0 = 0x101;
      local_2de = 0;
      std::__cxx11::string::string(local_2d8,"",&local_ac2);
      local_2b8 = 0x2400000000;
      local_2b0 = 0;
      local_2a8 = 0x8ed00000004;
      local_2a0 = 0;
      cfd::core::Script::Script(&local_298);
      local_260 = 0;
      cfd::core::Script::Script(&local_258);
      local_220 = 0x101;
      local_21e = 0;
      std::__cxx11::string::string(local_218,"",&local_ac3);
      local_1f8 = 0x3400000000;
      local_1f0 = 0;
      local_1e8 = 0x4ca00000004;
      local_1e0 = 0;
      cfd::core::Script::Script(&local_1d8);
      local_1a0 = 0;
      cfd::core::Script::Script(&local_198);
      local_160 = 0x101;
      local_15e = 1;
      std::__cxx11::string::string(local_158,"",&local_ac4);
      local_138 = 0x2400000000;
      local_130 = 0;
      local_128 = 0x4da00000004;
      local_120 = 0;
      cfd::core::Script::Script(&local_118);
      local_e0 = 0;
      cfd::core::Script::Script(&local_d8);
      local_a0 = 0x101;
      local_9e = 1;
      std::__cxx11::string::string(local_98,"",&local_ac5);
      local_78 = 0x3400000000;
      local_70 = 0;
      __l._M_len = 0xd;
      __l._M_array = (iterator)&script_template;
      std::
      vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
      ::vector(&TestBody::test_vector,__l,&local_ac6);
      lVar4 = 0x900;
      do {
        TestEstimateConfidentialTxInSizeVector::~TestEstimateConfidentialTxInSizeVector
                  ((TestEstimateConfidentialTxInSizeVector *)
                   ((long)&script_template._vptr_Script + lVar4));
        lVar4 = lVar4 + -0xc0;
      } while (lVar4 != -0xc0);
      std::__cxx11::string::~string((string *)&local_a88);
      std::__cxx11::string::~string((string *)&gtest_ar);
      __cxa_atexit(std::
                   vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
                   ::~vector,&TestBody::test_vector,&__dso_handle);
      __cxa_guard_release(&TestBody()::test_vector);
    }
  }
  local_ab8 = TestBody::test_vector.
              super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pTVar3 = TestBody::test_vector.
           super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (hex = &(TestBody::test_vector.
               super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
               ._M_impl.super__Vector_impl_data._M_start)->script_template;
      (pointer)&hex[-5].field_2 != pTVar3; hex = hex + 6) {
    vsize = 0;
    cfd::core::Script::Script(&script_template,hex);
    scriptsig_template = (Script *)hex->_M_string_length;
    if ((Script *)hex->_M_string_length != (Script *)0x0) {
      scriptsig_template = &script_template;
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        addr_type = *(AddressType *)&hex[-5].field_2;
        cfd::core::Script::Script(&local_68,(Script *)(hex + -4));
        pegin_btc_tx_size = *(uint32_t *)((long)&hex[-3].field_2 + 8);
        cfd::core::Script::Script(&local_a60,(Script *)(hex + -2));
        local_a68 = (ulong)(byte)hex[-1].field_2._M_local_buf[10];
        vsize = cfd::core::ConfidentialTxIn::EstimateTxInVsize
                          (addr_type,&local_68,pegin_btc_tx_size,&local_a60,
                           (bool)hex[-1].field_2._M_local_buf[8],
                           (bool)hex[-1].field_2._M_local_buf[9],
                           (bool)hex[-1].field_2._M_local_buf[10],scriptsig_template,
                           *(int *)&hex[1]._M_dataplus._M_p,
                           *(int *)((long)&hex[1]._M_dataplus._M_p + 4),(uint32_t *)0x0,
                           (uint32_t)hex[1]._M_string_length);
        cfd::core::Script::~Script(&local_a60);
        cfd::core::Script::~Script(&local_68);
        pTVar3 = local_ab8;
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x14a,
                 "Expected: (vsize = ConfidentialTxIn::EstimateTxInVsize( test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx, test_data.claim_script, test_data.is_issuance, test_data.is_blind, test_data.is_reissuance, template_ptr, test_data.exponent, test_data.minimum_bits, nullptr, test_data.txoutproof_size)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a88,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a88);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"vsize","test_data.size",&vsize,
               (uint *)(hex[-5].field_2._M_local_buf + 4));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a88);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_ab0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x14b,message);
      testing::internal::AssertHelper::operator=(&local_ab0,(Message *)&local_a88);
      testing::internal::AssertHelper::~AssertHelper(&local_ab0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a88);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Script::~Script(&script_template);
  }
  return;
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInVsize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 113, 0, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 69, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 83, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 106, 0, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 252, 0, Script(), 226,
     Script("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 151, 0, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, /*1645*/ 2253, 0, Script(), 0, Script(), true, true, false, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 2285, 0, Script(), 0, Script(), true, true, false, "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, /*922*/ 1226, 0, Script(), 0, Script(), true, true, true, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 1242, 0, Script(), 0, Script(), true, true, true, "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    EXPECT_NO_THROW((vsize = ConfidentialTxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, nullptr,
        test_data.txoutproof_size)));
    EXPECT_EQ(vsize, test_data.size);
  }
}